

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

void __thiscall MODEL3D::three_dim_model::initialize_layer_boundary_map(three_dim_model *this)

{
  initializer_list<int> __l;
  bool bVar1;
  pointer __x;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_90;
  _Self local_70;
  iterator i;
  allocator<int> local_51;
  int local_50 [4];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> spots;
  iterator i_end;
  three_dim_model *this_local;
  
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&this->layer_boundary_map);
  spots.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
                ::end(&this->polygons_map);
  local_50[0] = 0;
  local_50[1] = 0;
  local_50[2] = 0;
  local_50[3] = 0;
  local_40 = local_50;
  local_38 = 4;
  std::allocator<int>::allocator(&local_51);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,__l,&local_51);
  std::allocator<int>::~allocator(&local_51);
  local_70._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
       ::begin(&this->polygons_map);
  while( true ) {
    bVar1 = std::operator!=(&local_70,
                            (_Self *)&spots.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    __x = std::
          _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
          ::operator->(&local_70);
    std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::
    pair<const_unsigned_int_&,_std::vector<int,_std::allocator<int>_>_&,_true>
              (&local_90,&__x->first,(vector<int,_std::allocator<int>_> *)local_30);
    std::
    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::insert(&this->layer_boundary_map,&local_90);
    std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair(&local_90);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>
    ::operator++(&local_70,0);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return;
}

Assistant:

void MODEL3D::three_dim_model::initialize_layer_boundary_map()
{
    layer_boundary_map.clear();
    auto i_end = polygons_map.end();
    std::vector<int> spots = {0,0,0,0};
    for (auto i = polygons_map.begin(); i != i_end; i++)
    {
        layer_boundary_map.insert({i->first, spots});
    }
}